

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void config_init_default(trans2p_config *conf)

{
  char *in_RDI;
  
  in_RDI[0x10c] = '\0';
  strncpy(in_RDI,"i2p0",0x100);
  in_RDI[0x100] = -0x24;
  in_RDI[0x101] = '\x05';
  in_RDI[0x102] = '\0';
  in_RDI[0x103] = '\0';
  inet_pton(2,"10.55.0.1",in_RDI + 0x104);
  inet_pton(2,"255.255.0.0",in_RDI + 0x108);
  strncpy(in_RDI + 0x214,"127.0.0.1",0x100);
  in_RDI[0x314] = -0x1a;
  in_RDI[0x315] = '\x1d';
  in_RDI[0x316] = '\0';
  in_RDI[0x317] = '\0';
  in_RDI[0x318] = '\x01';
  strncpy(in_RDI + 0x110,"127.0.0.1",0x100);
  in_RDI[0x210] = -0x4f;
  in_RDI[0x211] = '\x15';
  in_RDI[0x212] = '\0';
  in_RDI[0x213] = '\0';
  return;
}

Assistant:

void config_init_default(struct trans2p_config * conf)
{
  conf->tun.enabled = false;
  strncpy(conf->tun.ifname, "i2p0", sizeof(conf->tun.ifname));
  conf->tun.mtu = 1500;
  inet_pton(AF_INET, "10.55.0.1", &conf->tun.addr);
  inet_pton(AF_INET, "255.255.0.0", &conf->tun.netmask);
  
  strncpy(conf->i2cp.addr, "127.0.0.1", sizeof(conf->i2cp.addr));
  conf->i2cp.port = 7654;
  conf->i2cp.enabled = true;

  strncpy(conf->dns.addr, "127.0.0.1", sizeof(conf->dns.addr));
  conf->dns.port = 5553;
}